

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O1

QDataStream * operator>>(QDataStream *in,QBitArray *ba)

{
  byte *pbVar1;
  char cVar2;
  Data *pDVar3;
  qsizetype qVar4;
  char *pcVar5;
  int iVar6;
  quint8 *c;
  qint64 qVar7;
  undefined1 *puVar8;
  ulong uVar9;
  long lVar10;
  long len;
  long in_FS_OFFSET;
  quint32 tmp;
  undefined1 *local_58;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::clear(&ba->d);
  if (in->ver < 0x14) {
    local_40 = (undefined1 *)CONCAT44(local_40._4_4_,0xaaaaaaaa);
    QDataStream::operator>>(in,(qint32 *)&local_40);
    iVar6 = (int)local_40;
    local_58 = (undefined1 *)(long)(int)local_40;
    if ((long)local_58 < 0) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      QDataStream::setStatus(in,ReadCorruptData);
    }
    if (iVar6 < 0) goto LAB_0035c200;
  }
  else {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(in,(qint64 *)&local_40);
    local_58 = local_40;
    if ((long)local_40 < 0) {
      QDataStream::setStatus(in,SizeLimitExceeded);
      goto LAB_0035c200;
    }
  }
  if (local_58 == (undefined1 *)0x0) {
    QByteArray::clear(&ba->d);
  }
  else {
    uVar9 = (ulong)(local_58 + 7) >> 3;
    for (lVar10 = 0; len = uVar9 - lVar10, len != 0 && lVar10 <= (long)uVar9; lVar10 = lVar10 + len)
    {
      if (0x7fffff < len) {
        len = 0x800000;
      }
      QByteArray::resize(&ba->d,len + lVar10 + 1);
      pDVar3 = (ba->d).d.d;
      if ((pDVar3 == (Data *)0x0) ||
         (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>
         )) {
        QByteArray::reallocData(&ba->d,(ba->d).d.size,KeepSize);
      }
      qVar7 = QDataStream::readRawData(in,(ba->d).d.ptr + lVar10 + 1,len);
      if (qVar7 != len) {
        QByteArray::clear(&ba->d);
        QDataStream::setStatus(in,ReadPastEnd);
        goto LAB_0035c200;
      }
    }
    pDVar3 = (ba->d).d.d;
    qVar4 = (ba->d).d.size;
    if ((pDVar3 == (Data *)0x0) ||
       (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>))
    {
      QByteArray::reallocData(&ba->d,qVar4,KeepSize);
    }
    pDVar3 = (ba->d).d.d;
    cVar2 = (ba->d).d.ptr[qVar4 + -1];
    if ((pDVar3 == (Data *)0x0) ||
       (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>))
    {
      QByteArray::reallocData(&ba->d,(ba->d).d.size,KeepSize);
    }
    pcVar5 = (ba->d).d.ptr;
    *pcVar5 = (char)((int)(ba->d).d.size << 3) - (char)local_58;
    if (((ulong)local_58 & 7) != 0) {
      puVar8 = local_58 + 7;
      if (-1 < (long)local_58) {
        puVar8 = local_58;
      }
      pbVar1 = (byte *)(pcVar5 + ((long)puVar8 >> 3) + 1);
      *pbVar1 = *pbVar1 & ~(-1 << (sbyte)((ulong)local_58 & 7));
    }
    pDVar3 = (ba->d).d.d;
    qVar4 = (ba->d).d.size;
    if ((pDVar3 == (Data *)0x0) ||
       (1 < (__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>))
    {
      QByteArray::reallocData(&ba->d,qVar4,KeepSize);
    }
    if ((ba->d).d.ptr[qVar4 + -1] != cVar2) {
      QByteArray::clear(&ba->d);
      QDataStream::setStatus(in,ReadCorruptData);
    }
  }
LAB_0035c200:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &in, QBitArray &ba)
{
    ba.clear();
    qsizetype len;
    if (in.version() < QDataStream::Qt_6_0) {
        quint32 tmp;
        in >> tmp;
        if (Q_UNLIKELY(tmp > quint32((std::numeric_limits<qint32>::max)()))) {
            in.setStatus(QDataStream::ReadCorruptData);
            return in;
        }
        len = tmp;
    } else {
        quint64 tmp;
        in >> tmp;
        if (Q_UNLIKELY(tmp > quint64((std::numeric_limits<qsizetype>::max)()))) {
            in.setStatus(QDataStream::Status::SizeLimitExceeded);
            return in;
        }
        len = tmp;
    }
    if (len == 0) {
        ba.clear();
        return in;
    }

    const qsizetype Step = 8 * 1024 * 1024;
    const qsizetype totalBytes = storage_size(len);
    qsizetype allocated = 0;

    while (allocated < totalBytes) {
        qsizetype blockSize = qMin(Step, totalBytes - allocated);
        ba.d.resize(allocated + blockSize + 1);
        if (in.readRawData(ba.d.data() + 1 + allocated, blockSize) != blockSize) {
            ba.clear();
            in.setStatus(QDataStream::ReadPastEnd);
            return in;
        }
        allocated += blockSize;
    }

    const auto fromStream = ba.d.back();
    adjust_head_and_tail(ba.d.data(), ba.d.size(), len);
    if (ba.d.back() != fromStream) {
        ba.clear();
        in.setStatus(QDataStream::ReadCorruptData);
        return in;
    }
    return in;
}